

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommDummy.cpp
# Opt level: O2

void __thiscall
adios2::helper::CommImplDummy::Gather
          (CommImplDummy *this,void *sendbuf,size_t sendcount,Datatype sendtype,void *recvbuf,
          size_t recvcount,Datatype recvtype,int root,string *param_8)

{
  size_t sVar1;
  size_t sVar2;
  undefined8 extraout_RAX;
  allocator local_51;
  string local_50;
  
  if (sendbuf == (void *)0x0 && sendcount != 0) {
    std::__cxx11::string::string((string *)&local_50,"sendbuf is null",&local_51);
    anon_unknown_8::CommDummyError(&local_50);
LAB_0045e95b:
    std::__cxx11::string::string((string *)&local_50,"recvbuf is null",&local_51);
    anon_unknown_8::CommDummyError(&local_50);
  }
  else {
    if (recvbuf == (void *)0x0 && recvcount != 0) goto LAB_0045e95b;
    if (root == 0) {
      sVar1 = CommImpl::SizeOf(sendtype);
      sVar2 = CommImpl::SizeOf(recvtype);
      if (sVar2 * recvcount - sVar1 * sendcount == 0) {
        memcpy(recvbuf,sendbuf,sVar1 * sendcount);
        return;
      }
      goto LAB_0045e99b;
    }
  }
  std::__cxx11::string::string((string *)&local_50,"root is not 0",&local_51);
  anon_unknown_8::CommDummyError(&local_50);
LAB_0045e99b:
  std::__cxx11::string::string((string *)&local_50,"send and recv sizes differ",&local_51);
  anon_unknown_8::CommDummyError(&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void CommImplDummy::Gather(const void *sendbuf, size_t sendcount, Datatype sendtype, void *recvbuf,
                           size_t recvcount, Datatype recvtype, int root, const std::string &) const
{
    if (sendcount > 0 && !sendbuf)
    {
        return CommDummyError("sendbuf is null");
    }
    if (recvcount > 0 && !recvbuf)
    {
        return CommDummyError("recvbuf is null");
    }
    if (root != 0)
    {
        return CommDummyError("root is not 0");
    }

    const size_t nsent = sendcount * CommImpl::SizeOf(sendtype);
    const size_t nrecv = recvcount * CommImpl::SizeOf(recvtype);

    if (nrecv != nsent)
    {
        return CommDummyError("send and recv sizes differ");
    }

    std::memcpy(recvbuf, sendbuf, nsent);
}